

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

bool __thiscall
bssl::is_valid_client_hello_inner
          (bssl *this,SSL *ssl,uint8_t *out_alert,Span<const_unsigned_char> body)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint16_t version;
  CBS extension;
  CBS versions;
  SSL_CLIENT_HELLO client_hello;
  ushort local_c2;
  CBS local_c0;
  CBS local_b0;
  SSL_CLIENT_HELLO local_a0;
  
  iVar2 = SSL_parse_client_hello((SSL *)this,&local_a0,out_alert,(size_t)body.data_);
  if ((((iVar2 == 0) || (bVar1 = ssl_client_hello_get_extension(&local_a0,&local_c0,0xfe0d), !bVar1)
       ) || (local_c0.len != 1)) ||
     ((*local_c0.data != '\x01' ||
      (bVar1 = ssl_client_hello_get_extension(&local_a0,&local_c0,0x2b), !bVar1)))) {
    *(undefined1 *)&ssl->method = 0x2f;
    iVar2 = 0x13a;
    iVar3 = 0x68;
  }
  else {
    iVar2 = CBS_get_u8_length_prefixed(&local_c0,&local_b0);
    if (((iVar2 != 0) && (local_c0.len == 0)) && (local_b0.len != 0)) {
      if (local_b0.len == 0) {
        return true;
      }
      do {
        iVar2 = CBS_get_u16(&local_b0,&local_c2);
        if (iVar2 == 0) {
          *(undefined1 *)&ssl->method = 0x32;
          iVar2 = 0x89;
          iVar3 = 0x79;
LAB_00135adc:
          ERR_put_error(0x10,0,iVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,iVar3);
          return false;
        }
        if (((local_c2 - 0x300 < 4) || (local_c2 == 0xfeff)) || (local_c2 == 0xfefd)) {
          *(undefined1 *)&ssl->method = 0x2f;
          iVar2 = 0x13a;
          iVar3 = 0x80;
          goto LAB_00135adc;
        }
        if (local_b0.len == 0) {
          return true;
        }
      } while( true );
    }
    *(undefined1 *)&ssl->method = 0x32;
    iVar2 = 0x89;
    iVar3 = 0x72;
  }
  ERR_put_error(0x10,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,iVar3);
  return false;
}

Assistant:

static bool is_valid_client_hello_inner(SSL *ssl, uint8_t *out_alert,
                                        Span<const uint8_t> body) {
  // See draft-ietf-tls-esni-13, section 7.1.
  SSL_CLIENT_HELLO client_hello;
  CBS extension;
  if (!SSL_parse_client_hello(ssl, &client_hello, body.data(), body.size()) ||
      !ssl_client_hello_get_extension(&client_hello, &extension,
                                      TLSEXT_TYPE_encrypted_client_hello) ||
      CBS_len(&extension) != 1 ||  //
      CBS_data(&extension)[0] != ECH_CLIENT_INNER ||
      !ssl_client_hello_get_extension(&client_hello, &extension,
                                      TLSEXT_TYPE_supported_versions)) {
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_CLIENT_HELLO_INNER);
    return false;
  }
  // Parse supported_versions and reject TLS versions prior to TLS 1.3. Older
  // versions are incompatible with ECH.
  CBS versions;
  if (!CBS_get_u8_length_prefixed(&extension, &versions) ||
      CBS_len(&extension) != 0 ||  //
      CBS_len(&versions) == 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  while (CBS_len(&versions) != 0) {
    uint16_t version;
    if (!CBS_get_u16(&versions, &version)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    if (version == SSL3_VERSION || version == TLS1_VERSION ||
        version == TLS1_1_VERSION || version == TLS1_2_VERSION ||
        version == DTLS1_VERSION || version == DTLS1_2_VERSION) {
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_CLIENT_HELLO_INNER);
      return false;
    }
  }
  return true;
}